

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

void png_set_sRGB_gAMA_and_cHRM(png_const_structrp png_ptr,png_inforp info_ptr,int srgb_intent)

{
  png_uint_16 *ppVar1;
  int iVar2;
  
  if (info_ptr == (png_inforp)0x0 || png_ptr == (png_const_structrp)0x0) {
    return;
  }
  iVar2 = png_colorspace_set_sRGB(png_ptr,&info_ptr->colorspace,srgb_intent);
  if (iVar2 != 0) {
    ppVar1 = &(info_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 0x18;
  }
  png_colorspace_sync_info(png_ptr,info_ptr);
  return;
}

Assistant:

void PNGAPI
png_set_sRGB_gAMA_and_cHRM(png_const_structrp png_ptr, png_inforp info_ptr,
    int srgb_intent)
{
   png_debug1(1, "in %s storage function", "sRGB_gAMA_and_cHRM");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (png_colorspace_set_sRGB(png_ptr, &info_ptr->colorspace,
       srgb_intent) != 0)
   {
      /* This causes the gAMA and cHRM to be written too */
      info_ptr->colorspace.flags |=
         PNG_COLORSPACE_FROM_gAMA|PNG_COLORSPACE_FROM_cHRM;
   }

   png_colorspace_sync_info(png_ptr, info_ptr);
}